

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

HelicsFederate helicsCreateCombinationFederateFromConfig(char *configFile,HelicsError *err)

{
  HelicsError *in_RSI;
  long in_RDI;
  shared_ptr<helics::Federate> fed;
  shared_ptr<helics::CombinationFederate> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  uint6 in_stack_ffffffffffffffa0;
  byte bVar1;
  allocator<char> in_stack_ffffffffffffffa7;
  FederateType in_stack_ffffffffffffffbc;
  shared_ptr<helics::Federate> *in_stack_ffffffffffffffc0;
  HelicsFederate local_8;
  
  if ((in_RSI == (HelicsError *)0x0) || (in_RSI->error_code == 0)) {
    if (in_RDI == 0) {
      assignError(in_RSI,-4,"The supplied string argument is null and therefore invalid");
      local_8 = (HelicsFederate)0x0;
    }
    else {
      std::shared_ptr<helics::Federate>::shared_ptr((shared_ptr<helics::Federate> *)0x1ba328);
      bVar1 = 0;
      if (in_RDI == 0) {
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffffa7,(uint7)in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff98);
      }
      else {
        std::allocator<char>::allocator();
        bVar1 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffffa7,CONCAT16(1,in_stack_ffffffffffffffa0)),
                   (char *)in_stack_ffffffffffffff98,
                   (allocator<char> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))
        ;
      }
      std::make_shared<helics::CombinationFederate,std::__cxx11::string_const>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff88._M_pi);
      std::shared_ptr<helics::Federate>::operator=
                ((shared_ptr<helics::Federate> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58
                );
      std::shared_ptr<helics::CombinationFederate>::~shared_ptr
                ((shared_ptr<helics::CombinationFederate> *)0x1ba3b6);
      std::__cxx11::string::~string(in_stack_ffffffffffffff60);
      if ((bVar1 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
      }
      std::shared_ptr<helics::Federate>::shared_ptr
                ((shared_ptr<helics::Federate> *)&stack0xffffffffffffff80,
                 (shared_ptr<helics::Federate> *)in_stack_ffffffffffffff58);
      local_8 = generateNewHelicsFederateObject(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc)
      ;
      std::shared_ptr<helics::Federate>::~shared_ptr((shared_ptr<helics::Federate> *)0x1ba49d);
      std::shared_ptr<helics::Federate>::~shared_ptr((shared_ptr<helics::Federate> *)0x1ba4ce);
    }
  }
  else {
    local_8 = (HelicsFederate)0x0;
  }
  return local_8;
}

Assistant:

HelicsFederate helicsCreateCombinationFederateFromConfig(const char* configFile, HelicsError* err)
{
    HELICS_ERROR_CHECK(err, nullptr);
    CHECK_NULL_STRING(configFile, nullptr);
    std::shared_ptr<helics::Federate> fed;
    try {
        fed = std::make_shared<helics::CombinationFederate>(AS_STRING(configFile));
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }

    return generateNewHelicsFederateObject(std::move(fed), helics::FederateType::COMBINATION);
}